

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatch.cpp
# Opt level: O0

int BmatchCommandInitTwoCircuits(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  abctime clkTotal;
  int pTime;
  int pVerbose;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  char **ppcStack_40;
  int nArgcNew;
  char **pArgvNew;
  int local_30;
  int fDelete2;
  int fDelete1;
  int c;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_30 = 0;
  pArgvNew._4_4_ = 0;
  clkTotal._4_4_ = 0;
  bVar1 = false;
  _fDelete1 = argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  aVar3 = Abc_Clock();
  Extra_UtilGetoptReset();
  while (fDelete2 = Extra_UtilGetopt(argv_local._4_4_,_fDelete1,"aAvVdRITh"), fDelete2 != -1) {
    switch(fDelete2) {
    case 0x41:
      clkTotal._4_4_ = clkTotal._4_4_ | 0xf;
      break;
    default:
      goto LAB_00a44fb2;
    case 0x49:
      clkTotal._4_4_ = clkTotal._4_4_ | 0x20;
      break;
    case 0x52:
      clkTotal._4_4_ = clkTotal._4_4_ | 0x10;
      break;
    case 0x54:
      bVar1 = true;
      break;
    case 0x56:
      clkTotal._4_4_ = clkTotal._4_4_ | 4;
      break;
    case 0x61:
      clkTotal._4_4_ = clkTotal._4_4_ | 3;
      break;
    case 100:
      clkTotal._4_4_ = clkTotal._4_4_ | 8;
      break;
    case 0x76:
      clkTotal._4_4_ = clkTotal._4_4_ | 1;
    }
  }
  ppcStack_40 = _fDelete1 + globalUtilOptind;
  pNtk1._4_4_ = argv_local._4_4_ - globalUtilOptind;
  if (pNtk1._4_4_ == 2) {
    iVar2 = Abc_NtkPrepareTwoNtks
                      (_stdout,(Abc_Ntk_t *)0x0,ppcStack_40,2,&pNtk2,(Abc_Ntk_t **)&pTime,&local_30,
                       (int *)((long)&pArgvNew + 4));
    if (iVar2 == 0) {
      pAbc_local._4_4_ = 1;
    }
    else {
      Bmatch_PrepNtks(pAStack_18,pNtk2,_pTime,clkTotal._4_4_);
      if (bVar1) {
        Abc_Print(1,"%s =","Total runtime");
        aVar4 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
      }
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    printf("Invalid command!\n");
LAB_00a44fb2:
    Abc_Print(-2,"usage: bmatchInit [-aAvVdRIT] <file1> <file2> \n");
    Abc_Print(-2,"       -v verbose \n");
    Abc_Print(-2,"       -a all verbose \n");
    Abc_Print(-2,"       -V supp information \n");
    Abc_Print(-2,"       -A All message \n");
    Abc_Print(-2,"       -d debug message \n");
    Abc_Print(-2,"       -R Resync cir1 & cir2 \n");
    Abc_Print(-2,"       -I show PI information \n");
    Abc_Print(-2,"       -T Print time information \n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int BmatchCommandInitTwoCircuits( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fDelete1 = 0, fDelete2 = 0;
    char ** pArgvNew;
    int nArgcNew;
    Abc_Ntk_t * pNtk1, * pNtk2;
    int pVerbose = 0, pTime = 0;
    abctime clkTotal = Abc_Clock();
 
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "aAvVdRITh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':   pVerbose |= 1;  break;
            case 'a':   pVerbose |= 3;  break;
            case 'V':   pVerbose |= 4;  break;
            case 'd':   pVerbose |= 8;  break;
            case 'A':   pVerbose |= 15; break;
            case 'R':   pVerbose |= 16; break;
            case 'I':   pVerbose |= 32; break;
            case 'T':   pTime = 1;      break;
            default:    goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if( nArgcNew != 2 )
    {
        printf("Invalid command!\n");
        goto usage;
    }
    if ( !Abc_NtkPrepareTwoNtks( stdout, NULL, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
        return 1;

    Bmatch_PrepNtks( pAbc, pNtk1, pNtk2, pVerbose );
    
    if( pTime )
        ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );

    return 0;

usage:
    Abc_Print( -2, "usage: bmatchInit [-aAvVdRIT] <file1> <file2> \n" );
    Abc_Print( -2, "       -v verbose \n" );
    Abc_Print( -2, "       -a all verbose \n" );
    Abc_Print( -2, "       -V supp information \n" );
    Abc_Print( -2, "       -A All message \n" );
    Abc_Print( -2, "       -d debug message \n" );
    Abc_Print( -2, "       -R Resync cir1 & cir2 \n" );
    Abc_Print( -2, "       -I show PI information \n" );
    Abc_Print( -2, "       -T Print time information \n" );
    return 1;
}